

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# datamanager.cpp
# Opt level: O0

bool __thiscall DataManager::ImportMeshFromFile(DataManager *this,string *filename)

{
  bool bVar1;
  string *filename_local;
  DataManager *this_local;
  
  bVar1 = OpenMesh::IO::read_mesh<OpenMesh::TriMesh_ArrayKernelT<MyTraits>>(&this->mesh_,filename);
  if (bVar1) {
    OpenMesh::TriMesh_ArrayKernelT<MyTraits>::operator=(&this->original_mesh_,&this->mesh_);
    OpenMesh::TriMesh_ArrayKernelT<MyTraits>::operator=(&this->noisy_mesh_,&this->mesh_);
    OpenMesh::TriMesh_ArrayKernelT<MyTraits>::operator=(&this->denoised_mesh_,&this->mesh_);
  }
  return bVar1;
}

Assistant:

bool DataManager::ImportMeshFromFile(std::string filename)
{
    if(!OpenMesh::IO::read_mesh(mesh_, filename))
        return false;
    else
    {
        original_mesh_ = mesh_;
        noisy_mesh_ = mesh_;
        denoised_mesh_ = mesh_;
        return true;
    }
}